

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_14_18(int n,unsigned_long *numbers,char **error)

{
  ulong local_28;
  dev_t dev;
  char **error_local;
  unsigned_long *numbers_local;
  int n_local;
  
  local_28 = 0;
  if (n == 2) {
    local_28 = (*numbers & 0x3fff) << 0x12 | numbers[1] & 0x3ffff;
    if ((long)(int)(*numbers & 0x3fff) != *numbers) {
      *error = "invalid major number";
    }
    if ((long)(int)((uint)local_28 & 0x3ffff) != numbers[1]) {
      *error = "invalid minor number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return local_28;
}

Assistant:

static dev_t
pack_14_18(int n, unsigned long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_14_18(numbers[0], numbers[1]);
		if ((unsigned long)major_14_18(dev) != numbers[0])
			*error = iMajorError;
		if ((unsigned long)minor_14_18(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}